

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::IntegerFunctionCase::iterate(IntegerFunctionCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  long lVar3;
  char *description;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ostringstream *poVar7;
  pointer pSVar8;
  long lVar9;
  vector<void_*,_std::allocator<void_*>_> curInputPtr;
  vector<void_*,_std::allocator<void_*>_> curOutputPtr;
  vector<void_*,_std::allocator<void_*>_> inputPointers;
  vector<void_*,_std::allocator<void_*>_> outputPointers;
  vector<int,_std::allocator<int>_> outScalarSizes;
  vector<int,_std::allocator<int>_> inScalarSizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputData;
  vector<void_*,_std::allocator<void_*>_> local_2b8;
  vector<void_*,_std::allocator<void_*>_> local_2a0;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *local_288;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *local_280;
  VarValue local_278;
  undefined1 local_268 [16];
  vector<void_*,_std::allocator<void_*>_> local_258;
  vector<void_*,_std::allocator<void_*>_> local_240;
  ostringstream *local_228;
  string *local_220;
  ulong local_218;
  vector<int,_std::allocator<int>_> local_210;
  vector<int,_std::allocator<int>_> local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  pSVar8 = (this->m_spec).inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = 0;
  iVar5 = 0;
  if (pSVar8 != (this->m_spec).inputs.
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar5 = 0;
    do {
      iVar2 = glu::VarType::getScalarSize(&pSVar8->varType);
      iVar5 = iVar5 + iVar2;
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != (this->m_spec).inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pSVar8 = (this->m_spec).outputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar8 != (this->m_spec).outputs.
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar4 = 0;
    do {
      iVar2 = glu::VarType::getScalarSize(&pSVar8->varType);
      iVar4 = iVar4 + iVar2;
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != (this->m_spec).outputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1c8,(long)(iVar5 * this->m_numValues),(allocator_type *)local_1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1e0,(long)(iVar4 * this->m_numValues),(allocator_type *)local_1b0);
  local_280 = &(this->m_spec).inputs;
  getInputOutputPointers(&local_258,local_280,&local_1c8,this->m_numValues);
  local_288 = &(this->m_spec).outputs;
  getInputOutputPointers(&local_240,local_288,&local_1e0,this->m_numValues);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)(uint)this->m_numValues,
             local_258.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  (*this->m_executor->_vptr_ShaderExecutor[5])();
  (*this->m_executor->_vptr_ShaderExecutor[6])
            (this->m_executor,(ulong)(uint)this->m_numValues,
             local_258.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_240.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  getScalarSizes(&local_1f8,local_280);
  getScalarSizes(&local_210,local_288);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (&local_2b8,
             (long)local_258.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_258.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)local_1b0);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (&local_2a0,
             (long)local_240.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_240.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)local_1b0);
  if (this->m_numValues < 1) {
    uVar6 = 0;
  }
  else {
    local_228 = &this->m_failMsg;
    local_220 = (string *)&this->field_0x108;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    uVar6 = 0;
    iVar4 = 0;
    do {
      if (0 < (int)((ulong)((long)local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar3 = 0;
        do {
          local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] =
               (void *)((long)(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar3] * iVar4) * 4 +
                       (long)local_258.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < (int)((ulong)((long)local_2b8.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2b8.
                                            super__Vector_base<void_*,_std::allocator<void_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      if (0 < (int)((ulong)((long)local_2a0.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2a0.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar3 = 0;
        do {
          local_2a0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] =
               (void *)((long)(local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar3] * iVar4) * 4 +
                       (long)local_240.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < (int)((ulong)((long)local_2a0.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_2a0.
                                            super__Vector_base<void_*,_std::allocator<void_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                        (this,local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      poVar7 = (ostringstream *)(local_1b0 + 8);
      if ((char)iVar5 == '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar7,"ERROR: comparison failed for value ",0x23);
        std::ostream::operator<<(poVar7,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,":\n  ",4);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),(char *)local_278.type,(long)local_278.value);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_278.type != (VarType *)local_268) {
          operator_delete(local_278.type,local_268._0_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar7 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar7);
        local_218 = uVar6;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"  inputs:",9);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar7);
        std::ios_base::~ios_base(local_138);
        if (0 < (int)((ulong)((long)local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3)) {
          lVar9 = 0x20;
          lVar3 = 0;
          do {
            poVar7 = (ostringstream *)(local_1b0 + 8);
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"    ",4);
            pSVar8 = (local_280->
                     super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar7,*(char **)((long)pSVar8 + lVar9 + -0x20),
                       *(long *)((long)pSVar8 + lVar9 + -0x18));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," = ",3);
            local_278.type =
                 (VarType *)
                 ((long)&(((local_280->
                           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                 lVar9);
            local_278.value =
                 local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
            tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&local_278);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
            std::ios_base::~ios_base(local_138);
            lVar3 = lVar3 + 1;
            lVar9 = lVar9 + 0x38;
          } while (lVar3 < (int)((ulong)((long)local_2b8.
                                               super__Vector_base<void_*,_std::allocator<void_*>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_2b8.
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),"  outputs:",10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        if (0 < (int)((ulong)((long)local_2a0.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2a0.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3)) {
          lVar9 = 0x20;
          lVar3 = 0;
          do {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"    ",4);
            pSVar8 = (local_288->
                     super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,*(char **)((long)pSVar8 + lVar9 + -0x20),
                       *(long *)((long)pSVar8 + lVar9 + -0x18));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
            local_278.type =
                 (VarType *)
                 ((long)&(((local_288->
                           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                 lVar9);
            local_278.value =
                 local_2a0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar3];
            tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&local_278);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            lVar3 = lVar3 + 1;
            lVar9 = lVar9 + 0x38;
          } while (lVar3 < (int)((ulong)((long)local_2a0.
                                               super__Vector_base<void_*,_std::allocator<void_*>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_2a0.
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        local_1b0._0_8_ = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x98644f);
        std::__cxx11::stringbuf::str(local_220);
        uVar6 = local_218;
        if ((TestLog *)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
        }
        std::ios::clear((int)*(undefined8 *)(*(long *)local_228 + -0x18) + (int)local_228);
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->m_numValues);
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar4 = (int)uVar6;
  std::ostream::operator<<(poVar1,this->m_numValues - iVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,this->m_numValues);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  description = "Pass";
  if (iVar4 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar4 != 0),
             description);
  if (local_2a0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a0.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_240.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_240.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_258.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IntegerFunctionCase::IterateResult IntegerFunctionCase::iterate (void)
{
	const int				numInputScalars			= computeTotalScalarSize(m_spec.inputs);
	const int				numOutputScalars		= computeTotalScalarSize(m_spec.outputs);
	vector<deUint32>		inputData				(numInputScalars * m_numValues);
	vector<deUint32>		outputData				(numOutputScalars * m_numValues);
	const vector<void*>		inputPointers			= getInputOutputPointers(m_spec.inputs, inputData, m_numValues);
	const vector<void*>		outputPointers			= getInputOutputPointers(m_spec.outputs, outputData, m_numValues);

	// Initialize input data.
	getInputValues(m_numValues, &inputPointers[0]);

	// Execute shader.
	m_executor->useProgram();
	m_executor->execute(m_numValues, &inputPointers[0], &outputPointers[0]);

	// Compare results.
	{
		const vector<int>		inScalarSizes		= getScalarSizes(m_spec.inputs);
		const vector<int>		outScalarSizes		= getScalarSizes(m_spec.outputs);
		vector<void*>			curInputPtr			(inputPointers.size());
		vector<void*>			curOutputPtr		(outputPointers.size());
		int						numFailed			= 0;

		for (int valNdx = 0; valNdx < m_numValues; valNdx++)
		{
			// Set up pointers for comparison.
			for (int inNdx = 0; inNdx < (int)curInputPtr.size(); ++inNdx)
				curInputPtr[inNdx] = (deUint32*)inputPointers[inNdx] + inScalarSizes[inNdx]*valNdx;

			for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); ++outNdx)
				curOutputPtr[outNdx] = (deUint32*)outputPointers[outNdx] + outScalarSizes[outNdx]*valNdx;

			if (!compare(&curInputPtr[0], &curOutputPtr[0]))
			{
				// \todo [2013-08-08 pyry] We probably want to log reference value as well?

				m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed for value " << valNdx << ":\n  " << m_failMsg.str() << TestLog::EndMessage;

				m_testCtx.getLog() << TestLog::Message << "  inputs:" << TestLog::EndMessage;
				for (int inNdx = 0; inNdx < (int)curInputPtr.size(); inNdx++)
					m_testCtx.getLog() << TestLog::Message << "    " << m_spec.inputs[inNdx].name << " = "
														   << VarValue(m_spec.inputs[inNdx].varType, curInputPtr[inNdx])
									   << TestLog::EndMessage;

				m_testCtx.getLog() << TestLog::Message << "  outputs:" << TestLog::EndMessage;
				for (int outNdx = 0; outNdx < (int)curOutputPtr.size(); outNdx++)
					m_testCtx.getLog() << TestLog::Message << "    " << m_spec.outputs[outNdx].name << " = "
														   << VarValue(m_spec.outputs[outNdx].varType, curOutputPtr[outNdx])
									   << TestLog::EndMessage;

				m_failMsg.str("");
				m_failMsg.clear();
				numFailed += 1;
			}
		}

		m_testCtx.getLog() << TestLog::Message << (m_numValues - numFailed) << " / " << m_numValues << " values passed" << TestLog::EndMessage;

		m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								numFailed == 0 ? "Pass"					: "Result comparison failed");
	}

	return STOP;
}